

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void QMakeEvaluator::initStatics(void)

{
  char *str;
  long lVar1;
  long in_FS_OFFSET;
  ProKey PStack_118;
  QLatin1String local_e8;
  QLatin1String local_d8;
  QLatin1String local_c8;
  QLatin1String local_b8;
  QLatin1String local_a8;
  ProString local_98;
  QLatin1String local_68;
  QLatin1String local_58;
  QLatin1String local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (QMakeInternal::statics._8_8_ == 0) {
    QLatin1String::QLatin1String(&local_48," ");
    QString::operator=((QString *)QMakeInternal::statics,(QLatin1String *)local_48.m_size);
    QLatin1String::QLatin1String(&local_58,"true");
    QString::operator=((QString *)(QMakeInternal::statics + 0x18),(QLatin1String *)local_58.m_size);
    QLatin1String::QLatin1String(&local_68,"false");
    QString::operator=((QString *)(QMakeInternal::statics + 0x30),(QLatin1String *)local_68.m_size);
    ProKey::ProKey((ProKey *)&local_98,"CONFIG");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x48),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"ARGS");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x78),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"ARGC");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0xa8),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QLatin1String::QLatin1String(&local_a8,".");
    QString::operator=((QString *)(QMakeInternal::statics + 0xd8),(QLatin1String *)local_a8.m_size);
    QLatin1String::QLatin1String(&local_b8,"..");
    QString::operator=((QString *)(QMakeInternal::statics + 0xf0),(QLatin1String *)local_b8.m_size);
    QLatin1String::QLatin1String(&local_c8,"ever");
    QString::operator=((QString *)(QMakeInternal::statics + 0x108),(QLatin1String *)local_c8.m_size)
    ;
    QLatin1String::QLatin1String(&local_d8,"forever");
    QString::operator=((QString *)(QMakeInternal::statics + 0x120),(QLatin1String *)local_d8.m_size)
    ;
    QLatin1String::QLatin1String(&local_e8,"host_build");
    QString::operator=((QString *)(QMakeInternal::statics + 0x138),(QLatin1String *)local_e8.m_size)
    ;
    ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x150),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_PLATFORM");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x180),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_DIR_SEP");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x1b0),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"QMAKESPEC");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x1e0),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProKey::ProKey((ProKey *)&local_98,"REQUIRES");
    ProString::operator=((ProString *)(QMakeInternal::statics + 0x210),&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ProString::ProString(&local_98,"_FAKE_");
    ProStringList::ProStringList((ProStringList *)&PStack_118,&local_98);
    QArrayDataPointer<ProString>::operator=
              ((QArrayDataPointer<ProString> *)(QMakeInternal::statics + 600),
               (QArrayDataPointer<ProString> *)&PStack_118);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&PStack_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    initFunctionStatics();
    QHash<ProKey,_ProKey>::reserve((QHash<ProKey,_ProKey> *)(QMakeInternal::statics + 0x250),0x15);
    for (lVar1 = 8; lVar1 != 0x158; lVar1 = lVar1 + 0x10) {
      str = *(char **)((long)&initStatics::mapInits[0].oldname + lVar1);
      ProKey::ProKey((ProKey *)&local_98,
                     *(char **)((long)&initFunctionStatics::testInits[0x22].args + lVar1));
      ProKey::ProKey(&PStack_118,str);
      QHash<ProKey,ProKey>::emplace<ProKey_const&>
                ((QHash<ProKey,ProKey> *)(QMakeInternal::statics + 0x250),(ProKey *)&local_98,
                 &PStack_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::initStatics()
{
    if (!statics.field_sep.isNull())
        return;

    statics.field_sep = QLatin1String(" ");
    statics.strtrue = QLatin1String("true");
    statics.strfalse = QLatin1String("false");
    statics.strCONFIG = ProKey("CONFIG");
    statics.strARGS = ProKey("ARGS");
    statics.strARGC = ProKey("ARGC");
    statics.strDot = QLatin1String(".");
    statics.strDotDot = QLatin1String("..");
    statics.strever = QLatin1String("ever");
    statics.strforever = QLatin1String("forever");
    statics.strhost_build = QLatin1String("host_build");
    statics.strTEMPLATE = ProKey("TEMPLATE");
    statics.strQMAKE_PLATFORM = ProKey("QMAKE_PLATFORM");
    statics.strQMAKE_DIR_SEP = ProKey("QMAKE_DIR_SEP");
    statics.strQMAKESPEC = ProKey("QMAKESPEC");
#ifdef PROEVALUATOR_FULL
    statics.strREQUIRES = ProKey("REQUIRES");
#endif

    statics.fakeValue = ProStringList(ProString("_FAKE_")); // It has to have a unique begin() value

    initFunctionStatics();

    static const struct {
        const char * const oldname, * const newname;
    } mapInits[] = {
        { "INTERFACES", "FORMS" },
        { "QMAKE_POST_BUILD", "QMAKE_POST_LINK" },
        { "TARGETDEPS", "POST_TARGETDEPS" },
        { "LIBPATH", "QMAKE_LIBDIR" },
        { "QMAKE_EXT_MOC", "QMAKE_EXT_CPP_MOC" },
        { "QMAKE_MOD_MOC", "QMAKE_H_MOD_MOC" },
        { "QMAKE_LFLAGS_SHAPP", "QMAKE_LFLAGS_APP" },
        { "PRECOMPH", "PRECOMPILED_HEADER" },
        { "PRECOMPCPP", "PRECOMPILED_SOURCE" },
        { "INCPATH", "INCLUDEPATH" },
        { "QMAKE_EXTRA_WIN_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_UNIX_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_WIN_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_INCLUDES", "QMAKE_EXTRA_INCLUDES" },
        { "QMAKE_EXTRA_UNIX_VARIABLES", "QMAKE_EXTRA_VARIABLES" },
        { "QMAKE_RPATH", "QMAKE_LFLAGS_RPATH" },
        { "QMAKE_FRAMEWORKDIR", "QMAKE_FRAMEWORKPATH" },
        { "QMAKE_FRAMEWORKDIR_FLAGS", "QMAKE_FRAMEWORKPATH_FLAGS" },
        { "IN_PWD", "PWD" },
        { "DEPLOYMENT", "INSTALLS" }
    };
    statics.varMap.reserve((int)(sizeof(mapInits)/sizeof(mapInits[0])));
    for (unsigned i = 0; i < sizeof(mapInits)/sizeof(mapInits[0]); ++i)
        statics.varMap.insert(ProKey(mapInits[i].oldname), ProKey(mapInits[i].newname));
}